

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O1

gme_err_t gme_track_info(Music_Emu *me,gme_info_t **out,int track)

{
  int iVar1;
  int iVar2;
  gme_info_t *__ptr;
  char *pcVar3;
  int iVar4;
  
  *out = (gme_info_t *)0x0;
  __ptr = (gme_info_t *)malloc(0x7e0);
  if (__ptr == (gme_info_t *)0x0) {
    pcVar3 = "Out of memory";
  }
  else {
    pcVar3 = Gme_File::track_info(&me->super_Gme_File,(track_info_t *)(__ptr + 1),track);
    if (pcVar3 == (blargg_err_t)0x0) {
      iVar1 = __ptr[1].loop_length;
      iVar2 = __ptr[1].i4;
      __ptr->length = iVar1;
      __ptr->intro_length = iVar2;
      iVar4 = __ptr[1].i6;
      __ptr->loop_length = iVar4;
      __ptr->i4 = -1;
      __ptr->i5 = -1;
      __ptr->i6 = -1;
      __ptr->i7 = -1;
      __ptr->i8 = -1;
      __ptr->i9 = -1;
      __ptr->i10 = -1;
      __ptr->i11 = -1;
      __ptr->i12 = -1;
      __ptr->i13 = -1;
      __ptr->i14 = -1;
      __ptr->i15 = -1;
      __ptr->s7 = (char *)"";
      __ptr->s8 = (char *)"";
      __ptr->s9 = (char *)"";
      __ptr->s10 = (char *)"";
      __ptr->s11 = (char *)"";
      __ptr->s12 = (char *)"";
      __ptr->s13 = (char *)"";
      __ptr->s14 = (char *)"";
      __ptr->s15 = (char *)"";
      __ptr->system = (char *)&__ptr[1].i8;
      __ptr->game = (char *)&__ptr[2].copyright;
      __ptr->song = (char *)&__ptr[3].s12;
      __ptr->author = (char *)&__ptr[5].i8;
      __ptr->copyright = (char *)&__ptr[6].copyright;
      iVar2 = iVar2 + iVar4 * 2;
      iVar4 = 150000;
      if (0 < iVar2) {
        iVar4 = iVar2;
      }
      __ptr->comment = (char *)&__ptr[7].s12;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      __ptr->dumper = (char *)&__ptr[9].i8;
      __ptr->play_length = iVar4;
      *out = __ptr;
      pcVar3 = (blargg_err_t)0x0;
    }
    else {
      free(__ptr);
    }
  }
  return pcVar3;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_track_info( Music_Emu const* me, gme_info_t** out, int track )
{
	*out = NULL;
	
	gme_info_t_* info = BLARGG_NEW gme_info_t_;
	CHECK_ALLOC( info );
	
	gme_err_t err = me->track_info( &info->info, track );
	if ( err )
	{
		gme_free_info( info );
		return err;
	}
	
	#define COPY(name) info->name = info->info.name;
	
	COPY( length );
	COPY( intro_length );
	COPY( loop_length );
	
	info->i4  = -1;
	info->i5  = -1;
	info->i6  = -1;
	info->i7  = -1;
	info->i8  = -1;
	info->i9  = -1;
	info->i10 = -1;
	info->i11 = -1;
	info->i12 = -1;
	info->i13 = -1;
	info->i14 = -1;
	info->i15 = -1;
	
	info->s7  = "";
	info->s8  = "";
	info->s9  = "";
	info->s10 = "";
	info->s11 = "";
	info->s12 = "";
	info->s13 = "";
	info->s14 = "";
	info->s15 = "";
	
	COPY( system );
	COPY( game );
	COPY( song );
	COPY( author );
	COPY( copyright );
	COPY( comment );
	COPY( dumper );
	
	#undef COPY
	
	info->play_length = info->length;
	if ( info->play_length <= 0 )
	{
		info->play_length = info->intro_length + 2 * info->loop_length; // intro + 2 loops
		if ( info->play_length <= 0 )
			info->play_length = 150 * 1000; // 2.5 minutes
	}
	
	*out = info;
	
	return 0;
}